

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void argsman_tests::TestParse(string *str,bool expected_bool,int64_t expected_int)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar1;
  byte in_SIL;
  long in_FS_OFFSET;
  string error;
  char *argv [2];
  string arg;
  TestArgsManager test;
  char *in_stack_fffffffffffff988;
  ArgsManager *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff998;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a0;
  const_string *in_stack_fffffffffffff9b0;
  char (*in_stack_fffffffffffff9b8) [7];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff9c0;
  allocator<char> *in_stack_fffffffffffff9c8;
  iterator in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  char **argv_00;
  ArgsManager *this;
  ArgsManager *local_5a0;
  undefined1 local_540 [71];
  allocator<char> local_4f9;
  int64_t local_4f8;
  undefined1 local_4f0 [16];
  allocator<char> local_49a;
  undefined1 local_499;
  undefined1 local_498 [16];
  undefined1 local_488 [70];
  allocator<char> local_442;
  undefined1 local_441;
  undefined1 local_440 [16];
  undefined1 local_430 [64];
  const_string local_3f0 [2];
  lazy_ostream local_3d0 [2];
  assertion_result local_3b0 [2];
  undefined4 local_374;
  undefined1 local_358 [176];
  char *local_2a8;
  char *local_2a0;
  undefined1 local_278 [624];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_358[0xf] = in_SIL & 1;
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_fffffffffffff988);
  local_374 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(Flags *)in_stack_fffffffffffff9b0)
  ;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff988);
  __l._M_len = (size_type)in_stack_fffffffffffff9d8;
  __l._M_array = in_stack_fffffffffffff9d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_fffffffffffff9c8,__l,(allocator_type *)in_stack_fffffffffffff9c0);
  TestArgsManager::SetupArgs
            ((TestArgsManager *)in_stack_fffffffffffff9d0,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_stack_fffffffffffff9c8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff998);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff988);
  this = (ArgsManager *)local_278;
  local_5a0 = (ArgsManager *)(local_278 + 0x28);
  do {
    local_5a0 = (ArgsManager *)&local_5a0[-1].m_cached_network_datadir_path;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_fffffffffffff988);
  } while (local_5a0 != this);
  std::operator+((char *)in_stack_fffffffffffff9d8,&in_stack_fffffffffffff9d0->first);
  local_2a8 = "ignored";
  local_2a0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff988);
  std::__cxx11::string::string(in_stack_fffffffffffff9a0);
  do {
    argv_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9c8,
               (const_string *)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    in_stack_fffffffffffffa47 =
         ArgsManager::ParseParameters
                   (this,(int)((ulong)local_5a0 >> 0x20),argv_00,
                    (string *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff998,
               SUB81((ulong)in_stack_fffffffffffff990 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff990,
               (basic_cstring<const_char> *)in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    in_stack_fffffffffffff988 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3b0,local_3d0,local_3f0,0x112,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff988);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff988);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9c8,
               (const_string *)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff990,(char (*) [1])in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffff998 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8
              );
    local_441 = ArgsManager::GetBoolArg
                          (in_stack_fffffffffffff990,(string *)in_stack_fffffffffffff988,(bool)uVar2
                          );
    in_stack_fffffffffffff998 = "expected_bool";
    in_stack_fffffffffffff990 = (ArgsManager *)(local_358 + 0xf);
    in_stack_fffffffffffff988 = "test.GetBoolArg(\"-value\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_430,local_440,0x113,1,2,&local_441);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988);
    std::allocator<char>::~allocator(&local_442);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff988);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9c8,
               (const_string *)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff990,(char (*) [1])in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffff998 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8
              );
    local_499 = ArgsManager::GetBoolArg
                          (in_stack_fffffffffffff990,(string *)in_stack_fffffffffffff988,(bool)uVar2
                          );
    in_stack_fffffffffffff998 = "expected_bool";
    in_stack_fffffffffffff990 = (ArgsManager *)(local_358 + 0xf);
    in_stack_fffffffffffff988 = "test.GetBoolArg(\"-value\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_488,local_498,0x114,1,2,&local_499);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988);
    std::allocator<char>::~allocator(&local_49a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff988);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9c8,
               (const_string *)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff990,(char (*) [1])in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8
              );
    local_4f8 = ArgsManager::GetIntArg
                          (in_stack_fffffffffffff990,(string *)in_stack_fffffffffffff988,
                           (int64_t)in_stack_fffffffffffff998);
    in_stack_fffffffffffff998 = "expected_int";
    in_stack_fffffffffffff990 = (ArgsManager *)local_358;
    in_stack_fffffffffffff988 = "test.GetIntArg(\"-value\", 99998)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&stack0xfffffffffffffb20,local_4f0,0x115,1,2,&local_4f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988);
    std::allocator<char>::~allocator(&local_4f9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff988);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9c8,
               (const_string *)in_stack_fffffffffffff9c0,(size_t)in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff990,(char (*) [1])in_stack_fffffffffffff988);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998,
               (pointer)in_stack_fffffffffffff990,(unsigned_long)in_stack_fffffffffffff988);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8
              );
    in_stack_fffffffffffff9d8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ArgsManager::GetIntArg
                   (in_stack_fffffffffffff990,(string *)in_stack_fffffffffffff988,
                    (int64_t)in_stack_fffffffffffff998);
    in_stack_fffffffffffff998 = "expected_int";
    in_stack_fffffffffffff990 = (ArgsManager *)local_358;
    in_stack_fffffffffffff988 = "test.GetIntArg(\"-value\", 99999)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_540,&stack0xfffffffffffffab0,0x116,1,2,&stack0xfffffffffffffaa8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff988);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffaa7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff988);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff988);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_fffffffffffff988);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestParse(const std::string& str, bool expected_bool, int64_t expected_int)
{
    TestArgsManager test;
    test.SetupArgs({{"-value", ArgsManager::ALLOW_ANY}});
    std::string arg = "-value=" + str;
    const char* argv[] = {"ignored", arg.c_str()};
    std::string error;
    BOOST_CHECK(test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), expected_bool);
    BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), expected_bool);
    BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99998), expected_int);
    BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), expected_int);
}